

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio-logger.cpp
# Opt level: O2

bool __thiscall AudioLogger::install(AudioLogger *this,Parameters *parameters)

{
  _Head_base<0UL,_AudioLogger::Data_*,_false> _Var1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  char *__format;
  uint uVar6;
  SDL_AudioSpec obtainedSpec;
  TFilterCoefficients local_7c;
  SDL_AudioSpec captureSpec;
  
  if (parameters->captureId < 0) {
    __format = "error : invalid captureId = %d\n";
LAB_0011b226:
    fprintf(_stderr,__format);
    return false;
  }
  if (parameters->nChannels < 0) {
    __format = "error : invalid nChannels = %d\n";
    goto LAB_0011b226;
  }
  if (parameters->sampleRate < 1) {
    __format = "error : invalid sampleRate = %d\n";
    goto LAB_0011b226;
  }
  if (parameters->freqCutoff_Hz <= 0.0) {
    fprintf(_stderr,"error : invalid freqCutoff_Hz = %g\n",
            SUB84((double)parameters->freqCutoff_Hz,0));
    return false;
  }
  _Var1._M_head_impl =
       (this->data_)._M_t.
       super___uniq_ptr_impl<AudioLogger::Data,_std::default_delete<AudioLogger::Data>_>._M_t.
       super__Tuple_impl<0UL,_AudioLogger::Data_*,_std::default_delete<AudioLogger::Data>_>.
       super__Head_base<0UL,_AudioLogger::Data_*,_false>._M_head_impl;
  if ((install(AudioLogger::Parameters&&)::isInitialized == '\0') &&
     (iVar2 = SDL_Init(0x10), iVar2 < 0)) {
    uVar5 = SDL_GetError();
    SDL_LogError(0,"Couldn\'t initialize SDL: %s\n",uVar5);
    return false;
  }
  install(AudioLogger::Parameters&&)::isInitialized = '\x01';
  uVar3 = SDL_GetNumAudioDevices(1);
  printf("Found %d capture devices:\n",(ulong)uVar3);
  uVar4 = 0;
  if (0 < (int)uVar3) {
    uVar4 = uVar3;
  }
  for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    uVar5 = SDL_GetAudioDeviceName(uVar6,1);
    printf("    - Capture device #%d: \'%s\'\n",(ulong)uVar6,uVar5);
  }
  if ((parameters->captureId < 0) || ((int)uVar3 <= parameters->captureId)) {
    __format = "error : invalid capture device id selected - %d\n";
    goto LAB_0011b226;
  }
  SDL_memset(&captureSpec,0,0x20);
  captureSpec.freq = (int)parameters->sampleRate;
  captureSpec.format = 0x8120;
  captureSpec.channels = (Uint8)parameters->nChannels;
  captureSpec.samples = 0x200;
  captureSpec.callback = anon_unknown.dwarf_4eb2e::cbAudioReady;
  captureSpec.userdata = this;
  SDL_memset(&obtainedSpec,0,0x20);
  uVar4 = parameters->captureId;
  uVar5 = SDL_GetAudioDeviceName(uVar4,1);
  printf("Attempt to open capture device %d : \'%s\' ...\n",(ulong)uVar4,uVar5);
  uVar5 = SDL_GetAudioDeviceName(parameters->captureId,1);
  uVar4 = SDL_OpenAudioDevice(uVar5,1,&captureSpec,&obtainedSpec,4);
  (_Var1._M_head_impl)->deviceIdIn = uVar4;
  if (uVar4 == 0) {
    uVar5 = SDL_GetError();
    SDL_LogError(0,"Couldn\'t open an audio device for capture: %s!\n",uVar5);
    SDL_Quit();
    return false;
  }
  if (obtainedSpec.format == 0x8120) {
    (_Var1._M_head_impl)->sampleSize_bytes = 4;
  }
  else if ((((obtainedSpec.format - 0x8008 < 0x19) &&
            ((0x1000101U >> (obtainedSpec.format - 0x8008 & 0x1f) & 1) != 0)) ||
           (obtainedSpec.format == 0x10)) || (obtainedSpec.format == 8)) {
    __format = "error : unsupported sample format %d\n";
    goto LAB_0011b226;
  }
  puts("Opened capture device succesfully!");
  printf("    DeviceId:   %d\n",(ulong)(_Var1._M_head_impl)->deviceIdIn);
  printf("    Frequency:  %d\n",(ulong)(uint)obtainedSpec.freq);
  printf("    Format:     %d (%d bytes)\n",(ulong)obtainedSpec.format,
         (ulong)(uint)(_Var1._M_head_impl)->sampleSize_bytes);
  printf("    Channels:   %d\n",(ulong)obtainedSpec.channels);
  printf("    Samples:    %d\n",(ulong)obtainedSpec.samples);
  if (parameters->nChannels != 0 && parameters->nChannels != (uint)obtainedSpec.channels) {
    printf("Warning: obtained number of channels (%d) does not match requested (%d)\n");
  }
  SDL_PauseAudioDevice((_Var1._M_head_impl)->deviceIdIn,0);
  parameters->nChannels = (uint)obtainedSpec.channels;
  if (parameters->filter == SecondOrderButterworthHighPass) {
    calculateCoefficientsSecondOrderButterworthHighPass
              (&local_7c,(int)parameters->freqCutoff_Hz,(int)parameters->sampleRate);
  }
  else {
    if (parameters->filter != FirstOrderHighPass) goto LAB_0011b16b;
    calculateCoefficientsFirstOrderHighPass
              (&local_7c,(int)parameters->freqCutoff_Hz,(int)parameters->sampleRate);
  }
  *(ulong *)((long)&(_Var1._M_head_impl)->filterCoefficients + 0x1c) =
       CONCAT44(local_7c.xnz2,local_7c.xnz1);
  *(undefined8 *)((long)&(_Var1._M_head_impl)->filterCoefficients + 0x24) = local_7c._36_8_;
  *(undefined8 *)((long)&(_Var1._M_head_impl)->filterCoefficients + 0x10) = local_7c._16_8_;
  *(ulong *)((long)&(_Var1._M_head_impl)->filterCoefficients + 0x18) =
       CONCAT44(local_7c.xnz1,local_7c.d0);
  ((_Var1._M_head_impl)->filterCoefficients).a0 = local_7c.a0;
  ((_Var1._M_head_impl)->filterCoefficients).a1 = local_7c.a1;
  *(undefined8 *)((long)&(_Var1._M_head_impl)->filterCoefficients + 8) = local_7c._8_8_;
LAB_0011b16b:
  Parameters::operator=(&(_Var1._M_head_impl)->parameters,parameters);
  LOCK();
  ((_Var1._M_head_impl)->isReady)._M_base = (__atomic_base<bool>)0x1;
  UNLOCK();
  printf("    Audio Filter: %d\n",(ulong)parameters->filter);
  printf("    Cutoff frequency: %g Hz\n",SUB84((double)parameters->freqCutoff_Hz,0));
  puts("Capturing audio ..");
  return true;
}

Assistant:

bool AudioLogger::install(Parameters && parameters) {
    auto & data = getData();

    if (parameters.captureId < 0) {
        fprintf(stderr, "error : invalid captureId = %d\n", parameters.captureId);
        return false;
    }

    if (parameters.nChannels < 0) {
        fprintf(stderr, "error : invalid nChannels = %d\n", parameters.nChannels);
        return false;
    }

    if (parameters.sampleRate <= 0) {
        fprintf(stderr, "error : invalid sampleRate = %d\n", (int) parameters.sampleRate);
        return false;
    }

    if (parameters.freqCutoff_Hz <= 0) {
        fprintf(stderr, "error : invalid freqCutoff_Hz = %g\n", parameters.freqCutoff_Hz);
        return false;
    }

    static bool isInitialized = false;
    if (!isInitialized && SDL_Init(SDL_INIT_AUDIO) < 0) {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't initialize SDL: %s\n", SDL_GetError());
        return false;
    }
    isInitialized = true;

    int nDevices = SDL_GetNumAudioDevices(SDL_TRUE);
    printf("Found %d capture devices:\n", nDevices);
    for (int i = 0; i < nDevices; i++) {
        printf("    - Capture device #%d: '%s'\n", i, SDL_GetAudioDeviceName(i, SDL_TRUE));
    }

    if (parameters.captureId < 0 || parameters.captureId >= nDevices) {
        fprintf(stderr, "error : invalid capture device id selected - %d\n", parameters.captureId);
        return false;
    }

    SDL_AudioSpec captureSpec;
    SDL_zero(captureSpec);

    captureSpec.freq = parameters.sampleRate;
    captureSpec.format = AUDIO_F32SYS;
    captureSpec.channels = parameters.nChannels;
    captureSpec.samples = kSamplesPerFrame;
    captureSpec.callback = ::cbAudioReady;
    captureSpec.userdata = this;

    SDL_AudioSpec obtainedSpec;
    SDL_zero(obtainedSpec);

    printf("Attempt to open capture device %d : '%s' ...\n", parameters.captureId, SDL_GetAudioDeviceName(parameters.captureId, SDL_TRUE));
    data.deviceIdIn = SDL_OpenAudioDevice(SDL_GetAudioDeviceName(parameters.captureId, SDL_TRUE), SDL_TRUE, &captureSpec, &obtainedSpec, SDL_AUDIO_ALLOW_CHANNELS_CHANGE);
    if (!data.deviceIdIn) {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't open an audio device for capture: %s!\n", SDL_GetError());
        SDL_Quit();
        return false;
    }

    switch (obtainedSpec.format) {
        case AUDIO_U8:
        case AUDIO_S8:
        case AUDIO_U16SYS:
        case AUDIO_S16SYS:
        case AUDIO_S32SYS:
            {
                fprintf(stderr, "error : unsupported sample format %d\n", obtainedSpec.format);
                return false;
            }
            break;
        case AUDIO_F32SYS:
            {
                data.sampleSize_bytes = 4;
            }
            break;
    }

    printf("Opened capture device succesfully!\n");
    printf("    DeviceId:   %d\n", data.deviceIdIn);
    printf("    Frequency:  %d\n", obtainedSpec.freq);
    printf("    Format:     %d (%d bytes)\n", obtainedSpec.format, data.sampleSize_bytes);
    printf("    Channels:   %d\n", obtainedSpec.channels);
    printf("    Samples:    %d\n", obtainedSpec.samples);

    if (obtainedSpec.channels != parameters.nChannels && parameters.nChannels != 0) {
        printf("Warning: obtained number of channels (%d) does not match requested (%d)\n",
               obtainedSpec.channels, parameters.nChannels);
    }

    SDL_PauseAudioDevice(data.deviceIdIn, 0);

    parameters.nChannels = obtainedSpec.channels;

    switch (parameters.filter) {
        case EAudioFilter::None:
            {
            }
            break;
        case EAudioFilter::FirstOrderHighPass:
            {
                data.filterCoefficients = ::calculateCoefficientsFirstOrderHighPass(parameters.freqCutoff_Hz, parameters.sampleRate);
            }
            break;
        case EAudioFilter::SecondOrderButterworthHighPass:
            {
                data.filterCoefficients = ::calculateCoefficientsSecondOrderButterworthHighPass(parameters.freqCutoff_Hz, parameters.sampleRate);
            }
            break;
    };

    data.parameters = parameters;
    data.isReady = true;

    // print filter paramters
    printf("    Audio Filter: %d\n", parameters.filter);
    printf("    Cutoff frequency: %g Hz\n", parameters.freqCutoff_Hz);
    printf("Capturing audio ..\n");

    return true;
}